

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NoMeEdgeCalculator.cpp
# Opt level: O1

bool __thiscall
NoMeEdgeCalculator::scoreReads
          (NoMeEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,bool isClique,
          int numGCAllowedPos,int ct)

{
  string *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  pair<int,_int> pVar13;
  AlignmentRecord *this_00;
  double dVar14;
  double dVar15;
  int in_stack_fffffffffffff1c8;
  double local_e20;
  double local_e18;
  double local_e08;
  string local_df8;
  string local_dd8;
  uint local_db4;
  string local_db0;
  string local_d90;
  string local_d70;
  string local_d50;
  string local_d30;
  string local_d10;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  string local_c90;
  string local_c70;
  string local_c50;
  string local_c30;
  string local_c10;
  string local_bf0;
  string local_bd0;
  string local_bb0;
  string local_b90;
  string local_b70;
  string local_b50;
  string local_b30;
  string local_b10;
  string local_af0;
  string local_ad0;
  string local_ab0;
  string local_a90;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  bVar2 = AlignmentRecord::isPairedEnd(ap1);
  bVar3 = AlignmentRecord::isPairedEnd(ap2);
  if (bVar2 && bVar3) {
    uVar5 = AlignmentRecord::getEnd1(ap1);
    uVar6 = AlignmentRecord::getEnd2(ap1);
    local_db4 = AlignmentRecord::getStart1(ap1);
    uVar7 = AlignmentRecord::getStart2(ap1);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    uVar9 = AlignmentRecord::getEnd2(ap2);
    uVar10 = AlignmentRecord::getStart1(ap2);
    uVar11 = AlignmentRecord::getStart2(ap2);
    if (uVar6 < uVar7 && uVar5 < uVar10) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
LAB_00159d7e:
      operator_delete(local_dd8._M_dataplus._M_p);
      return false;
    }
    if (uVar9 < uVar7 && uVar8 < local_db4) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
      goto LAB_00159d7e;
    }
    if (uVar6 < uVar11 && uVar8 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
      goto LAB_00159d7e;
    }
    if (uVar5 < uVar11 && uVar9 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
      goto LAB_00159d7e;
    }
    if (uVar8 < local_db4 && uVar5 < uVar11) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
      goto LAB_00159d7e;
    }
    if (uVar5 < uVar10 && uVar8 < uVar7) {
      AlignmentRecord::getName_abi_cxx11_(&local_dd8,ap1);
      lVar12 = std::__cxx11::string::find((char *)&local_dd8,0x19981e,0);
      if (lVar12 != -1) {
        AlignmentRecord::getName_abi_cxx11_(&local_df8,ap2);
        std::__cxx11::string::find((char *)&local_df8,0x19981e,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_df8._M_dataplus._M_p != &local_df8.field_2) {
          operator_delete(local_df8._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_dd8._M_dataplus._M_p == &local_dd8.field_2) {
        return false;
      }
      goto LAB_00159d7e;
    }
  }
  bVar4 = AlignmentRecord::isSingleEnd(ap1);
  if ((bVar4) && (bVar4 = AlignmentRecord::isSingleEnd(ap2), bVar4)) {
    AlignmentRecord::getCode1_abi_cxx11_(&local_50,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_70,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_90,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_b0,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart1(ap2);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    dVar14 = scoreSequences(this,&local_50,&local_70,&local_90,&local_b0,uVar5,uVar6,uVar7,uVar8,
                            bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    return (bool)(-(dVar14 == 1.0) & 1);
  }
  this_00 = ap1;
  bVar4 = AlignmentRecord::isSingleEnd(ap1);
  if ((!bVar3 || !bVar4) &&
     ((!bVar2 || (this_00 = ap2, bVar2 = AlignmentRecord::isSingleEnd(ap2), !bVar2)))) {
    uVar5 = pairedReadDetermination((NoMeEdgeCalculator *)this_00,ap1,ap2);
    switch(uVar5) {
    case 1:
      AlignmentRecord::getCode1_abi_cxx11_(&local_450,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_470,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_490,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_4b0,ap2);
      uVar5 = AlignmentRecord::getStart1(ap1);
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_450,&local_470,&local_490,&local_4b0,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_4d0,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_4f0,ap1);
      AlignmentRecord::getCode2_abi_cxx11_(&local_510,ap2);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_530,ap2);
      uVar5 = AlignmentRecord::getStart2(ap1);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart2(ap2);
      uVar8 = AlignmentRecord::getEnd2(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e18 = scoreSequences(this,&local_4d0,&local_4f0,&local_510,&local_530,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
        operator_delete(local_4f0._M_dataplus._M_p);
      }
      local_ad0._M_dataplus._M_p = local_4d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
LAB_0015b8a2:
        operator_delete(local_ad0._M_dataplus._M_p);
      }
      break;
    case 2:
    case 8:
      AlignmentRecord::getCode1_abi_cxx11_(&local_550,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_570,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_590,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_5b0,ap2);
      uVar5 = AlignmentRecord::getStart1(ap1);
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_550,&local_570,&local_590,&local_5b0,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
        operator_delete(local_5b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_590._M_dataplus._M_p != &local_590.field_2) {
        operator_delete(local_590._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_570._M_dataplus._M_p != &local_570.field_2) {
        operator_delete(local_570._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_550._M_dataplus._M_p != &local_550.field_2) {
        operator_delete(local_550._M_dataplus._M_p);
      }
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_5d0,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_5f0,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_610,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_630,ap2);
      uVar5 = AlignmentRecord::getStart2(ap1);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e08 = scoreSequences(this,&local_5d0,&local_5f0,&local_610,&local_630,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630._M_dataplus._M_p != &local_630.field_2) {
        operator_delete(local_630._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._M_dataplus._M_p != &local_610.field_2) {
        operator_delete(local_610._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
        operator_delete(local_5f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
        operator_delete(local_5d0._M_dataplus._M_p);
      }
      if (local_e08 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_650,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_670,ap1);
      AlignmentRecord::getCode2_abi_cxx11_(&local_690,ap2);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_6b0,ap2);
      uVar5 = AlignmentRecord::getStart2(ap1);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart2(ap2);
      uVar8 = AlignmentRecord::getEnd2(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e18 = scoreSequences(this,&local_650,&local_670,&local_690,&local_6b0,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
        operator_delete(local_6b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_690._M_dataplus._M_p != &local_690.field_2) {
        operator_delete(local_690._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_670._M_dataplus._M_p != &local_670.field_2) {
        operator_delete(local_670._M_dataplus._M_p);
      }
      dVar14 = local_e18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_650._M_dataplus._M_p != &local_650.field_2) {
LAB_0015a2e1:
        operator_delete(local_650._M_dataplus._M_p);
        dVar14 = local_e18;
      }
joined_r0x0015beda:
      if (dVar14 < 0.0) {
        return false;
      }
      dVar15 = local_e20 + 0.0 + local_e08;
      goto LAB_0015b8c9;
    case 3:
    case 9:
      AlignmentRecord::getCode1_abi_cxx11_(&local_6d0,ap1);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_6f0,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_710,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_730,ap2);
      uVar5 = AlignmentRecord::getStart1(ap1);
      uVar6 = AlignmentRecord::getEnd1(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e20 = scoreSequences(this,&local_6d0,&local_6f0,&local_710,&local_730,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_730._M_dataplus._M_p != &local_730.field_2) {
        operator_delete(local_730._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_710._M_dataplus._M_p != &local_710.field_2) {
        operator_delete(local_710._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
        operator_delete(local_6f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
        operator_delete(local_6d0._M_dataplus._M_p);
      }
      if (local_e20 < 0.0) {
        return false;
      }
      AlignmentRecord::getCode2_abi_cxx11_(&local_750,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_770,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_790,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_7b0,ap2);
      uVar5 = AlignmentRecord::getStart2(ap1);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e18 = scoreSequences(this,&local_750,&local_770,&local_790,&local_7b0,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
        operator_delete(local_7b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_790._M_dataplus._M_p != &local_790.field_2) {
        operator_delete(local_790._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_770._M_dataplus._M_p != &local_770.field_2) {
        operator_delete(local_770._M_dataplus._M_p);
      }
      local_ad0._M_dataplus._M_p = local_750._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_750._M_dataplus._M_p != &local_750.field_2) goto LAB_0015b8a2;
      break;
    default:
      if ((uVar5 & 0xe) == 4) {
        AlignmentRecord::getCode2_abi_cxx11_(&local_7d0,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_7f0,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_810,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_830,ap2);
        uVar5 = AlignmentRecord::getStart2(ap1);
        uVar6 = AlignmentRecord::getEnd2(ap1);
        uVar7 = AlignmentRecord::getStart1(ap2);
        uVar8 = AlignmentRecord::getEnd1(ap2);
        bVar2 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_7d0,&local_7f0,&local_810,&local_830,uVar5,uVar6,
                                   uVar7,uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_830._M_dataplus._M_p != &local_830.field_2) {
          operator_delete(local_830._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
          operator_delete(local_7f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p);
        }
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode2_abi_cxx11_(&local_850,ap1);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_870,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_890,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_8b0,ap2);
        uVar5 = AlignmentRecord::getStart2(ap1);
        uVar6 = AlignmentRecord::getEnd2(ap1);
        uVar7 = AlignmentRecord::getStart2(ap2);
        uVar8 = AlignmentRecord::getEnd2(ap2);
        bVar2 = AlignmentRecord::isStrand1(ap1);
        local_e18 = scoreSequences(this,&local_850,&local_870,&local_890,&local_8b0,uVar5,uVar6,
                                   uVar7,uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
          operator_delete(local_8b0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_870._M_dataplus._M_p != &local_870.field_2) {
          operator_delete(local_870._M_dataplus._M_p);
        }
        local_ad0._M_dataplus._M_p = local_850._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_850._M_dataplus._M_p != &local_850.field_2) goto LAB_0015b8a2;
      }
      else {
        if ((uVar5 != 0xd) && (uVar5 != 7)) {
          if (uVar5 == 6) {
            AlignmentRecord::getCode1_abi_cxx11_(&local_8d0,ap1);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_8f0,ap1);
            AlignmentRecord::getCode1_abi_cxx11_(&local_910,ap2);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_930,ap2);
            uVar5 = AlignmentRecord::getStart1(ap1);
            uVar6 = AlignmentRecord::getEnd1(ap1);
            uVar7 = AlignmentRecord::getStart1(ap2);
            uVar8 = AlignmentRecord::getEnd1(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            local_e20 = scoreSequences(this,&local_8d0,&local_8f0,&local_910,&local_930,uVar5,uVar6,
                                       uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                       in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_930._M_dataplus._M_p != &local_930.field_2) {
              operator_delete(local_930._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_910._M_dataplus._M_p != &local_910.field_2) {
              operator_delete(local_910._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
              operator_delete(local_8f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
              operator_delete(local_8d0._M_dataplus._M_p);
            }
            if (local_e20 < 0.0) {
              return false;
            }
            AlignmentRecord::getCode1_abi_cxx11_(&local_950,ap1);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_970,ap1);
            AlignmentRecord::getCode2_abi_cxx11_(&local_990,ap2);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_9b0,ap2);
            uVar5 = AlignmentRecord::getStart1(ap1);
            uVar6 = AlignmentRecord::getEnd1(ap1);
            uVar7 = AlignmentRecord::getStart2(ap2);
            uVar8 = AlignmentRecord::getEnd2(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            local_e08 = scoreSequences(this,&local_950,&local_970,&local_990,&local_9b0,uVar5,uVar6,
                                       uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                       in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
              operator_delete(local_9b0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_990._M_dataplus._M_p != &local_990.field_2) {
              operator_delete(local_990._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_970._M_dataplus._M_p != &local_970.field_2) {
              operator_delete(local_970._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._M_dataplus._M_p != &local_950.field_2) {
              operator_delete(local_950._M_dataplus._M_p);
            }
            if (local_e08 < 0.0) {
              return false;
            }
            AlignmentRecord::getCode2_abi_cxx11_(&local_9d0,ap1);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_9f0,ap1);
            AlignmentRecord::getCode2_abi_cxx11_(&local_a10,ap2);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_a30,ap2);
            uVar5 = AlignmentRecord::getStart2(ap1);
            uVar6 = AlignmentRecord::getEnd2(ap1);
            uVar7 = AlignmentRecord::getStart2(ap2);
            uVar8 = AlignmentRecord::getEnd2(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            local_e18 = scoreSequences(this,&local_9d0,&local_9f0,&local_a10,&local_a30,uVar5,uVar6,
                                       uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                       in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
              operator_delete(local_a30._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
              operator_delete(local_a10._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
              operator_delete(local_9f0._M_dataplus._M_p);
            }
            local_650._M_dataplus._M_p = local_9d0._M_dataplus._M_p;
            dVar14 = local_e18;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) goto LAB_0015a2e1;
          }
          else {
            if ((uVar5 & 0xe) == 10) {
              AlignmentRecord::getCode1_abi_cxx11_(&local_b50,ap1);
              AlignmentRecord::getGcQuality1_abi_cxx11_(&local_b70,ap1);
              AlignmentRecord::getCode2_abi_cxx11_(&local_b90,ap2);
              AlignmentRecord::getGcQuality2_abi_cxx11_(&local_bb0,ap2);
              uVar5 = AlignmentRecord::getStart1(ap1);
              uVar6 = AlignmentRecord::getEnd1(ap1);
              uVar7 = AlignmentRecord::getStart2(ap2);
              uVar8 = AlignmentRecord::getEnd2(ap2);
              bVar2 = AlignmentRecord::isStrand1(ap1);
              local_e20 = scoreSequences(this,&local_b50,&local_b70,&local_b90,&local_bb0,uVar5,
                                         uVar6,uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                         in_stack_fffffffffffff1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bb0._M_dataplus._M_p != &local_bb0.field_2) {
                operator_delete(local_bb0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b90._M_dataplus._M_p != &local_b90.field_2) {
                operator_delete(local_b90._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b70._M_dataplus._M_p != &local_b70.field_2) {
                operator_delete(local_b70._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b50._M_dataplus._M_p != &local_b50.field_2) {
                operator_delete(local_b50._M_dataplus._M_p);
              }
              if (local_e20 < 0.0) {
                return false;
              }
              AlignmentRecord::getCode2_abi_cxx11_(&local_bd0,ap1);
              AlignmentRecord::getGcQuality2_abi_cxx11_(&local_bf0,ap1);
              AlignmentRecord::getCode2_abi_cxx11_(&local_c10,ap2);
              AlignmentRecord::getGcQuality2_abi_cxx11_(&local_c30,ap2);
              uVar5 = AlignmentRecord::getStart2(ap1);
              uVar6 = AlignmentRecord::getEnd2(ap1);
              uVar7 = AlignmentRecord::getStart2(ap2);
              uVar8 = AlignmentRecord::getEnd2(ap2);
              bVar2 = AlignmentRecord::isStrand1(ap1);
              local_e18 = scoreSequences(this,&local_bd0,&local_bf0,&local_c10,&local_c30,uVar5,
                                         uVar6,uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                         in_stack_fffffffffffff1c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c30._M_dataplus._M_p != &local_c30.field_2) {
                operator_delete(local_c30._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c10._M_dataplus._M_p != &local_c10.field_2) {
                operator_delete(local_c10._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bf0._M_dataplus._M_p != &local_bf0.field_2) {
                operator_delete(local_bf0._M_dataplus._M_p);
              }
              local_ad0._M_dataplus._M_p = local_bd0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_bd0._M_dataplus._M_p != &local_bd0.field_2) goto LAB_0015b8a2;
              break;
            }
            dVar15 = 0.0;
            if (uVar5 != 0xc) goto LAB_0015b8cd;
            AlignmentRecord::getCode1_abi_cxx11_(&local_c50,ap1);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_c70,ap1);
            AlignmentRecord::getCode1_abi_cxx11_(&local_c90,ap2);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_cb0,ap2);
            uVar5 = AlignmentRecord::getStart1(ap1);
            uVar6 = AlignmentRecord::getEnd1(ap1);
            uVar7 = AlignmentRecord::getStart1(ap2);
            uVar8 = AlignmentRecord::getEnd1(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            local_e20 = scoreSequences(this,&local_c50,&local_c70,&local_c90,&local_cb0,uVar5,uVar6,
                                       uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                       in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cb0._M_dataplus._M_p != &local_cb0.field_2) {
              operator_delete(local_cb0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c90._M_dataplus._M_p != &local_c90.field_2) {
              operator_delete(local_c90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c70._M_dataplus._M_p != &local_c70.field_2) {
              operator_delete(local_c70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c50._M_dataplus._M_p != &local_c50.field_2) {
              operator_delete(local_c50._M_dataplus._M_p);
            }
            if (local_e20 < 0.0) {
              return false;
            }
            AlignmentRecord::getCode1_abi_cxx11_(&local_cd0,ap1);
            AlignmentRecord::getGcQuality1_abi_cxx11_(&local_cf0,ap1);
            AlignmentRecord::getCode2_abi_cxx11_(&local_d10,ap2);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_d30,ap2);
            uVar5 = AlignmentRecord::getStart1(ap1);
            uVar6 = AlignmentRecord::getEnd1(ap1);
            uVar7 = AlignmentRecord::getStart2(ap2);
            uVar8 = AlignmentRecord::getEnd2(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            local_e08 = scoreSequences(this,&local_cd0,&local_cf0,&local_d10,&local_d30,uVar5,uVar6,
                                       uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                       in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d30._M_dataplus._M_p != &local_d30.field_2) {
              operator_delete(local_d30._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d10._M_dataplus._M_p != &local_d10.field_2) {
              operator_delete(local_d10._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cf0._M_dataplus._M_p != &local_cf0.field_2) {
              operator_delete(local_cf0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_cd0._M_dataplus._M_p != &local_cd0.field_2) {
              operator_delete(local_cd0._M_dataplus._M_p);
            }
            if (local_e08 < 0.0) {
              return false;
            }
            AlignmentRecord::getCode2_abi_cxx11_(&local_d50,ap1);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_d70,ap1);
            AlignmentRecord::getCode2_abi_cxx11_(&local_d90,ap2);
            AlignmentRecord::getGcQuality2_abi_cxx11_(&local_db0,ap2);
            uVar5 = AlignmentRecord::getStart2(ap1);
            uVar6 = AlignmentRecord::getEnd2(ap1);
            uVar7 = AlignmentRecord::getStart2(ap2);
            uVar8 = AlignmentRecord::getEnd2(ap2);
            bVar2 = AlignmentRecord::isStrand1(ap1);
            dVar14 = scoreSequences(this,&local_d50,&local_d70,&local_d90,&local_db0,uVar5,uVar6,
                                    uVar7,uVar8,bVar2,false,numGCAllowedPos,
                                    in_stack_fffffffffffff1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_db0._M_dataplus._M_p != &local_db0.field_2) {
              operator_delete(local_db0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d90._M_dataplus._M_p != &local_d90.field_2) {
              operator_delete(local_d90._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d70._M_dataplus._M_p != &local_d70.field_2) {
              operator_delete(local_d70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d50._M_dataplus._M_p != &local_d50.field_2) {
              operator_delete(local_d50._M_dataplus._M_p);
            }
          }
          goto joined_r0x0015beda;
        }
        AlignmentRecord::getCode1_abi_cxx11_(&local_a50,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_a70,ap1);
        AlignmentRecord::getCode1_abi_cxx11_(&local_a90,ap2);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_ab0,ap2);
        uVar5 = AlignmentRecord::getStart1(ap1);
        uVar6 = AlignmentRecord::getEnd1(ap1);
        uVar7 = AlignmentRecord::getStart1(ap2);
        uVar8 = AlignmentRecord::getEnd1(ap2);
        bVar2 = AlignmentRecord::isStrand1(ap1);
        local_e20 = scoreSequences(this,&local_a50,&local_a70,&local_a90,&local_ab0,uVar5,uVar6,
                                   uVar7,uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ab0._M_dataplus._M_p != &local_ab0.field_2) {
          operator_delete(local_ab0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
          operator_delete(local_a90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
          operator_delete(local_a70._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a50._M_dataplus._M_p != &local_a50.field_2) {
          operator_delete(local_a50._M_dataplus._M_p);
        }
        if (local_e20 < 0.0) {
          return false;
        }
        AlignmentRecord::getCode1_abi_cxx11_(&local_ad0,ap1);
        AlignmentRecord::getGcQuality1_abi_cxx11_(&local_af0,ap1);
        AlignmentRecord::getCode2_abi_cxx11_(&local_b10,ap2);
        AlignmentRecord::getGcQuality2_abi_cxx11_(&local_b30,ap2);
        uVar5 = AlignmentRecord::getStart1(ap1);
        uVar6 = AlignmentRecord::getEnd1(ap1);
        uVar7 = AlignmentRecord::getStart2(ap2);
        uVar8 = AlignmentRecord::getEnd2(ap2);
        bVar2 = AlignmentRecord::isStrand1(ap1);
        local_e18 = scoreSequences(this,&local_ad0,&local_af0,&local_b10,&local_b30,uVar5,uVar6,
                                   uVar7,uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8
                                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b30._M_dataplus._M_p != &local_b30.field_2) {
          operator_delete(local_b30._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b10._M_dataplus._M_p != &local_b10.field_2) {
          operator_delete(local_b10._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_af0._M_dataplus._M_p != &local_af0.field_2) {
          operator_delete(local_af0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_ad0._M_dataplus._M_p != &local_ad0.field_2) goto LAB_0015b8a2;
      }
    }
    if (local_e18 < 0.0) {
      return false;
    }
    dVar15 = local_e20 + 0.0;
    dVar14 = local_e18;
    goto LAB_0015b8c9;
  }
  pVar13 = mixedReadDetermination((NoMeEdgeCalculator *)this_00,ap1,ap2);
  if ((ulong)pVar13 >> 0x20 == 0 || pVar13.first == 0) {
    return false;
  }
  if (pVar13.first != 1) {
    dVar15 = 0.0;
    dVar14 = 0.0;
    if (pVar13.second == 1) {
      AlignmentRecord::getCode2_abi_cxx11_(&local_3d0,ap1);
      AlignmentRecord::getGcQuality2_abi_cxx11_(&local_3f0,ap1);
      AlignmentRecord::getCode1_abi_cxx11_(&local_410,ap2);
      AlignmentRecord::getGcQuality1_abi_cxx11_(&local_430,ap2);
      uVar5 = AlignmentRecord::getStart2(ap1);
      uVar6 = AlignmentRecord::getEnd2(ap1);
      uVar7 = AlignmentRecord::getStart1(ap2);
      uVar8 = AlignmentRecord::getEnd1(ap2);
      bVar2 = AlignmentRecord::isStrand1(ap1);
      local_e18 = scoreSequences(this,&local_3d0,&local_3f0,&local_410,&local_430,uVar5,uVar6,uVar7,
                                 uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p);
      }
      psVar1 = &local_3d0;
      goto LAB_0015b26a;
    }
    goto LAB_0015b8c9;
  }
  switch(pVar13.second) {
  case 1:
    AlignmentRecord::getCode1_abi_cxx11_(&local_d0,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_f0,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_110,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_130,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart1(ap2);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    dVar14 = scoreSequences(this,&local_d0,&local_f0,&local_110,&local_130,uVar5,uVar6,uVar7,uVar8,
                            bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_e18 = 0.0;
    dVar15 = local_e18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_0015b281:
      operator_delete(local_d0._M_dataplus._M_p);
      dVar15 = local_e18;
    }
    break;
  case 2:
    AlignmentRecord::getCode1_abi_cxx11_(&local_150,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_170,ap1);
    AlignmentRecord::getCode2_abi_cxx11_(&local_190,ap2);
    AlignmentRecord::getGcQuality2_abi_cxx11_(&local_1b0,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart2(ap2);
    uVar8 = AlignmentRecord::getEnd2(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    local_e18 = scoreSequences(this,&local_150,&local_170,&local_190,&local_1b0,uVar5,uVar6,uVar7,
                               uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
      operator_delete(local_1b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    psVar1 = &local_150;
LAB_0015b26a:
    local_d0._M_dataplus._M_p = *(pointer *)((psVar1->field_2)._M_local_buf + -0x10);
    dVar14 = 0.0;
    dVar15 = local_e18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &psVar1->field_2) goto LAB_0015b281;
    break;
  case 3:
    AlignmentRecord::getCode1_abi_cxx11_(&local_1d0,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_1f0,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_210,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_230,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart1(ap2);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    local_e20 = scoreSequences(this,&local_1d0,&local_1f0,&local_210,&local_230,uVar5,uVar6,uVar7,
                               uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p);
    }
    if ((local_e20 == -1.0) && (!NAN(local_e20))) {
      return false;
    }
    AlignmentRecord::getCode1_abi_cxx11_(&local_250,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_270,ap1);
    AlignmentRecord::getCode2_abi_cxx11_(&local_290,ap2);
    AlignmentRecord::getGcQuality2_abi_cxx11_(&local_2b0,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart2(ap2);
    uVar8 = AlignmentRecord::getEnd2(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    local_e18 = scoreSequences(this,&local_250,&local_270,&local_290,&local_2b0,uVar5,uVar6,uVar7,
                               uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    local_350._M_dataplus._M_p = local_250._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
LAB_0015b13a:
      operator_delete(local_350._M_dataplus._M_p);
    }
    goto LAB_0015b13f;
  case 4:
    AlignmentRecord::getCode1_abi_cxx11_(&local_2d0,ap1);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_2f0,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_310,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_330,ap2);
    uVar5 = AlignmentRecord::getStart1(ap1);
    uVar6 = AlignmentRecord::getEnd1(ap1);
    uVar7 = AlignmentRecord::getStart1(ap2);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    local_e20 = scoreSequences(this,&local_2d0,&local_2f0,&local_310,&local_330,uVar5,uVar6,uVar7,
                               uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if ((local_e20 == -1.0) && (!NAN(local_e20))) {
      return false;
    }
    AlignmentRecord::getCode2_abi_cxx11_(&local_350,ap1);
    AlignmentRecord::getGcQuality2_abi_cxx11_(&local_370,ap1);
    AlignmentRecord::getCode1_abi_cxx11_(&local_390,ap2);
    AlignmentRecord::getGcQuality1_abi_cxx11_(&local_3b0,ap2);
    uVar5 = AlignmentRecord::getStart2(ap1);
    uVar6 = AlignmentRecord::getEnd2(ap1);
    uVar7 = AlignmentRecord::getStart1(ap2);
    uVar8 = AlignmentRecord::getEnd1(ap2);
    bVar2 = AlignmentRecord::isStrand1(ap1);
    local_e18 = scoreSequences(this,&local_350,&local_370,&local_390,&local_3b0,uVar5,uVar6,uVar7,
                               uVar8,bVar2,false,numGCAllowedPos,in_stack_fffffffffffff1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) goto LAB_0015b13a;
LAB_0015b13f:
    dVar15 = local_e18;
    dVar14 = local_e20;
    if ((local_e18 == -1.0) && (!NAN(local_e18))) {
      return false;
    }
    break;
  default:
    dVar15 = 0.0;
    dVar14 = 0.0;
  }
LAB_0015b8c9:
  dVar15 = dVar15 + dVar14;
LAB_0015b8cd:
  return 2.0 <= dVar15;
}

Assistant:

bool NoMeEdgeCalculator::scoreReads(const AlignmentRecord& ap1, const AlignmentRecord& ap2, bool isClique,int numGCAllowedPos, int ct) const{

    double score =0;

    double scorePair1 = 0;
    double scorePair2 = 0;


    bool pe1 = ap1.isPairedEnd();
    bool pe2 = ap2.isPairedEnd();

    // special cases of paired end reads for which no edge is allowed
    if(pe1 && pe2){

        unsigned int e11= ap1.getEnd1();
        unsigned int e12= ap1.getEnd2();
        unsigned int s11= ap1.getStart1();
        unsigned int s12= ap1.getStart2();
        unsigned int e21= ap2.getEnd1();
        unsigned int e22= ap2.getEnd2();
        unsigned int s21= ap2.getStart1();
        unsigned int s22= ap2.getStart2();
        //--------   ---------
        //           ---------   -------
        if(e11 < s21 && e12 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }

            return false;
        } //         ---------    ---------
        //-------    ---------
        else if(e21 < s11 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        } // ------------     ----------
        //   -----------                  ---------
        else if(e21 < s12 && e12 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//-----------            ----------
        //-----------  ----------
        else if(e11 < s22 && e22 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//          --------- ---------
        //----------           ---------
        else if (e21 < s11 && e11 < s22){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }//--------             --------
        //           --------   --------
        else if(e11 < s21 && e21 < s12){
            if((ap1.getName().find("Clique") != string::npos)&&(ap2.getName().find("Clique") != string::npos)){
            }
            return false;
        }
    }


    //Scoring for single ended cliques
     if(ap1.isSingleEnd() && ap2.isSingleEnd() ){
         score = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos, ct);
         if(score==1)return true;
         else return false;

     }



    //For mixed single and paired end cliques
    if((ap1.isSingleEnd() && pe2)||(pe1 && ap2.isSingleEnd())){
        std::pair<int , int> result =mixedReadDetermination(ap1,ap2);
        int first = result.first;
        int second = result.second;
        if(first==0||second==0){
            return false;
        }
        if(first==1){
            if(second==1){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair2 = 0;
            }else if(second == 2){
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }else if(second == 3){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }else if(second == 4){
                scorePair1 = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair1 == -1) return false;
                //For the second Mate
                scorePair2=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                if(scorePair2 == -1) return false;
            }
        }else{
            if(second == 1){
                scorePair2 = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
                scorePair1 = 0;
            }
        }

        if(scorePair1+scorePair2>=2)return true;
        else return false;


    }



     double tempScore = 0;
    //Scoring sequences for paired end cliques
    if(pe1&&pe2){
        int returnVal = pairedReadDetermination(ap1,ap2);
        if(returnVal == 1 ){
          tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
          tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
          if (tempScore < 0) return false;
          score += tempScore;
        }else if(returnVal == 2 || returnVal == 8){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 3 || returnVal == 9){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 4 || returnVal == 5){
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 6){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 7 || returnVal == 13){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore=scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 10 || returnVal == 11){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            //For the second Mate
            tempScore = scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }else if(returnVal == 12){
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode1(),ap2.getGcQuality1(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart1(),ap2.getEnd1() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore = scoreSequences(ap1.getCode1(),ap1.getGcQuality1(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart1(),ap1.getEnd1(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
            tempScore=scoreSequences(ap1.getCode2(),ap1.getGcQuality2(),ap2.getCode2(),ap2.getGcQuality2(),ap1.getStart2(),ap1.getEnd2(),ap2.getStart2(),ap2.getEnd2() , ap1.isStrand1(),isClique,numGCAllowedPos,ct);
            if (tempScore < 0) return false;
            score += tempScore;
        }

        if(score>=2)return true;
        else return false;
    }



}